

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

string * __thiscall
ev3dev::sensor::type_name_abi_cxx11_(string *__return_storage_ptr__,sensor *this)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string type;
  allocator_type local_2ba;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2b9;
  string local_2b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  driver_name_abi_cxx11_(&local_2b8,this);
  if (local_2b8._M_string_length == 0) {
    if (type_name[abi:cxx11]()::s_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&type_name[abi:cxx11]()::s_abi_cxx11_);
      if (iVar1 != 0) {
        type_name[abi:cxx11]()::s_abi_cxx11_._M_dataplus._M_p =
             (pointer)&type_name[abi:cxx11]()::s_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&type_name[abi:cxx11]()::s_abi_cxx11_,"<none>","");
        __cxa_atexit(std::__cxx11::string::~string,&type_name[abi:cxx11]()::s_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&type_name[abi:cxx11]()::s_abi_cxx11_);
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               type_name[abi:cxx11]()::s_abi_cxx11_._M_dataplus._M_p,
               type_name[abi:cxx11]()::s_abi_cxx11_._M_dataplus._M_p +
               type_name[abi:cxx11]()::s_abi_cxx11_._M_string_length);
  }
  else {
    if (type_name[abi:cxx11]()::lookup_table_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&type_name[abi:cxx11]()::lookup_table_abi_cxx11_);
      if (iVar1 != 0) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (local_298,(char (*) [15])"lego-ev3-touch",(char (*) [10])"EV3 touch");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (local_298 + 1,(char (*) [15])"lego-ev3-color",(char (*) [10])"EV3 color");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_const_char_(&)[15],_true>
                  (local_298 + 2,(char (*) [12])"lego-ev3-us",(char (*) [15])"EV3 ultrasonic");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[14],_const_char_(&)[9],_true>
                  (local_298 + 3,(char (*) [14])"lego-ev3-gyro",(char (*) [9])"EV3 gyro");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_const_char_(&)[13],_true>
                  (&local_198,(char (*) [12])"lego-ev3-ir",(char (*) [13])"EV3 infrared");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (&local_158,(char (*) [15])"lego-nxt-touch",(char (*) [10])"NXT touch");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (&local_118,(char (*) [15])"lego-nxt-light",(char (*) [10])"NXT light");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[10],_true>
                  (&local_d8,(char (*) [15])"lego-nxt-sound",(char (*) [10])"NXT sound");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_const_char_(&)[15],_true>
                  (&local_98,(char (*) [12])"lego-nxt-us",(char (*) [15])"NXT ultrasonic");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[15],_const_char_(&)[11],_true>
                  (&local_58,(char (*) [15])"nxt-i2c-sensor",(char (*) [11])"I2C sensor");
        __l._M_len = 10;
        __l._M_array = local_298;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(&type_name[abi:cxx11]()::lookup_table_abi_cxx11_,__l,&local_2b9,&local_2ba);
        lVar3 = 0x240;
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)((long)&local_298[0].first._M_dataplus._M_p + lVar3));
          lVar3 = lVar3 + -0x40;
        } while (lVar3 != -0x40);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::~map,&type_name[abi:cxx11]()::lookup_table_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&type_name[abi:cxx11]()::lookup_table_abi_cxx11_);
      }
    }
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&type_name[abi:cxx11]()::lookup_table_abi_cxx11_._M_t,&local_2b8);
    if ((_Rb_tree_header *)cVar2._M_node ==
        &type_name[abi:cxx11]()::lookup_table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                      local_2b8.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_2b8.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_2b8._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                      local_2b8.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = local_2b8._M_string_length;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_local_buf[0] = '\0';
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(cVar2._M_node + 2),
                 (long)&(cVar2._M_node[2]._M_parent)->_M_color + *(long *)(cVar2._M_node + 2));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string sensor::type_name() const {
    auto type = driver_name();
    if (type.empty()) {
        static const std::string s("<none>");
        return s;
    }

    static const std::map<sensor_type, const std::string> lookup_table {
        { ev3_touch,       "EV3 touch" },
        { ev3_color,       "EV3 color" },
        { ev3_ultrasonic,  "EV3 ultrasonic" },
        { ev3_gyro,        "EV3 gyro" },
        { ev3_infrared,    "EV3 infrared" },
        { nxt_touch,       "NXT touch" },
        { nxt_light,       "NXT light" },
        { nxt_sound,       "NXT sound" },
        { nxt_ultrasonic,  "NXT ultrasonic" },
        { nxt_i2c_sensor,  "I2C sensor" }
        };

    auto s = lookup_table.find(type);
    if (s != lookup_table.end())
        return s->second;

    return type;
}